

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ellswift_xdh
              (secp256k1_context *ctx,uchar *output,uchar *ell_a64,uchar *ell_b64,uchar *seckey32,
              int party,secp256k1_ellswift_xdh_hash_function hashfp,void *data)

{
  undefined4 extraout_EAX;
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  secp256k1_fe *r;
  long lVar5;
  uint uVar6;
  uchar *a;
  secp256k1_ge *a_00;
  uint64_t *puVar7;
  void *pvVar8;
  secp256k1_fe *psVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  uint negative;
  int overflow;
  uint64_t *local_e48;
  secp256k1_ge *local_e40;
  ulong local_e38;
  uchar *local_e30;
  uchar *local_e28;
  uchar *local_e20;
  secp256k1_ge t_1;
  secp256k1_fe local_db8;
  secp256k1_gej rj;
  secp256k1_scalar v2;
  secp256k1_scalar v1;
  secp256k1_fe local_cc8;
  secp256k1_fe xd;
  secp256k1_fe global_z;
  secp256k1_scalar local_c48;
  secp256k1_scalar s;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_fe xn;
  secp256k1_fe local_b90;
  secp256k1_fe local_b68;
  secp256k1_fe i;
  uint64_t local_b10;
  uint64_t uStack_b08;
  uint64_t local_b00;
  uint64_t uStack_af8;
  uint64_t local_af0;
  secp256k1_fe px;
  uint64_t local_590;
  uint64_t uStack_588;
  uint64_t local_580;
  uint64_t uStack_578;
  uint64_t local_570;
  
  bVar14 = 0;
  if (output == (uchar *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar10 = "output != NULL";
  }
  else if (ell_a64 == (uchar *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar10 = "ell_a64 != NULL";
  }
  else if (ell_b64 == (uchar *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar10 = "ell_b64 != NULL";
  }
  else if (seckey32 == (uchar *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar10 = "seckey32 != NULL";
  }
  else {
    if (hashfp != (secp256k1_ellswift_xdh_hash_function)0x0) {
      a = ell_a64;
      if (party == 0) {
        a = ell_b64;
      }
      local_e30 = output;
      local_e28 = ell_a64;
      local_e20 = ell_b64;
      secp256k1_fe_impl_set_b32_mod(&u,a);
      secp256k1_fe_impl_set_b32_mod(&t,a + 0x20);
      secp256k1_ellswift_xswiftec_frac_var(&xn,&xd,&u,&t);
      secp256k1_scalar_set_b32(&local_c48,seckey32,&overflow);
      auVar15._0_4_ = -(uint)((int)local_c48.d[2] == 0 && (int)local_c48.d[0] == 0);
      auVar15._4_4_ = -(uint)(local_c48.d[2]._4_4_ == 0 && local_c48.d[0]._4_4_ == 0);
      auVar15._8_4_ = -(uint)((int)local_c48.d[3] == 0 && (int)local_c48.d[1] == 0);
      auVar15._12_4_ = -(uint)(local_c48.d[3]._4_4_ == 0 && local_c48.d[1]._4_4_ == 0);
      iVar1 = movmskps(extraout_EAX,auVar15);
      overflow = (int)(iVar1 == 0xf);
      secp256k1_scalar_cmov(&local_c48,&secp256k1_scalar_one,overflow);
      secp256k1_fe_impl_sqr(&local_cc8,&xn);
      secp256k1_fe_impl_mul(&local_cc8,&local_cc8,&xn);
      secp256k1_fe_impl_sqr(&i,&xd);
      i.n[0] = i.n[0] * 7;
      i.n[1] = i.n[1] * 7;
      i.n[2] = i.n[2] * 7;
      i.n[3] = i.n[3] * 7;
      i.n[4] = i.n[4] * 7;
      secp256k1_fe_impl_mul(&i,&i,&xd);
      local_cc8.n[2] = local_cc8.n[2] + i.n[2];
      local_cc8.n[3] = local_cc8.n[3] + i.n[3];
      local_cc8.n[4] = local_cc8.n[4] + i.n[4];
      local_cc8.n[0] = local_cc8.n[0] + i.n[0];
      local_cc8.n[1] = local_cc8.n[1] + i.n[1];
      secp256k1_fe_impl_mul(&local_b90,&local_cc8,&xn);
      secp256k1_fe_impl_sqr(&local_b68,&local_cc8);
      secp256k1_scalar_add(&s,&local_c48,&secp256k1_ecmult_const_K);
      secp256k1_scalar_half(&s,&s);
      secp256k1_scalar_split_lambda(&v1,&v2,&s);
      secp256k1_scalar_add(&v1,&v1,(secp256k1_scalar *)secp256k1_ecmult_const_S_OFFSET);
      secp256k1_scalar_add(&v2,&v2,(secp256k1_scalar *)secp256k1_ecmult_const_S_OFFSET);
      rj.infinity = 0;
      rj.x.n[0] = local_b90.n[0];
      rj.x.n[1] = local_b90.n[1];
      rj.x.n[2] = local_b90.n[2];
      rj.x.n[3] = local_b90.n[3];
      rj.x.n[4] = local_b90.n[4];
      rj.y.n[0] = local_b68.n[0];
      rj.y.n[1] = local_b68.n[1];
      rj.y.n[2] = local_b68.n[2];
      rj.y.n[3] = local_b68.n[3];
      rj.y.n[4] = local_b68.n[4];
      rj.z.n[0] = 1;
      rj.z.n[1] = 0;
      rj.z.n[2] = 0;
      rj.z.n[3] = 0;
      rj.z.n[4] = 0;
      secp256k1_ecmult_odd_multiples_table(0x10,(secp256k1_ge *)&i,&px,&global_z,&rj);
      local_e48 = px.n;
      local_e40 = (secp256k1_ge *)&i;
      secp256k1_ge_table_set_globalz(0x10,(secp256k1_ge *)&i,&px);
      for (lVar12 = 0; lVar12 != 0x580; lVar12 = lVar12 + 0x58) {
        r = (secp256k1_fe *)((long)px.n + lVar12);
        puVar7 = (uint64_t *)((long)i.n + lVar12);
        psVar9 = r;
        for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
          psVar9->n[0] = *puVar7;
          puVar7 = puVar7 + (ulong)bVar14 * -2 + 1;
          psVar9 = (secp256k1_fe *)((long)psVar9 + ((ulong)bVar14 * -2 + 1) * 8);
        }
        secp256k1_fe_impl_mul(r,r,&secp256k1_const_beta);
      }
      psVar9 = &t_1.y;
      local_e40 = (secp256k1_ge *)&local_e40[1].y;
      local_e48 = ((secp256k1_fe *)((long)local_e48 + 0x78))->n + 1;
      uVar11 = 0x19;
      while (-1 < (int)uVar11) {
        uVar4 = (int)uVar11 * 5;
        local_e38 = uVar11;
        uVar2 = secp256k1_scalar_get_bits_var(&v1,uVar4,5);
        uVar3 = secp256k1_scalar_get_bits_var(&v2,uVar4,5);
        uVar4 = uVar2 >> 4 ^ 1;
        t_1.x.n[4] = i.n[4];
        t_1.x.n[2] = i.n[2];
        t_1.x.n[3] = i.n[3];
        t_1.x.n[0] = i.n[0];
        t_1.x.n[1] = i.n[1];
        t_1.y.n[0] = local_b10;
        t_1.y.n[1] = uStack_b08;
        t_1.y.n[4] = local_af0;
        t_1.y.n[2] = local_b00;
        t_1.y.n[3] = uStack_af8;
        a_00 = local_e40;
        for (uVar11 = 1; uVar11 != 0x10; uVar11 = uVar11 + 1) {
          uVar6 = (uint)(((-uVar4 ^ uVar2) & 0xf) == uVar11);
          secp256k1_fe_impl_cmov(&t_1.x,(secp256k1_fe *)((long)a_00 + -0x28),uVar6);
          secp256k1_fe_impl_cmov(psVar9,&a_00->x,uVar6);
          a_00 = (secp256k1_ge *)((long)a_00 + 0x50 + 8);
        }
        t_1.infinity = 0;
        local_db8.n[0] = 0x3ffffbfffff0bc - t_1.y.n[0];
        local_db8.n[1] = 0x3ffffffffffffc - t_1.y.n[1];
        local_db8.n[2] = 0x3ffffffffffffc - t_1.y.n[2];
        local_db8.n[3] = 0x3ffffffffffffc - t_1.y.n[3];
        local_db8.n[4] = 0x3fffffffffffc - t_1.y.n[4];
        secp256k1_fe_impl_cmov(psVar9,&local_db8,uVar4);
        if ((int)local_e38 == 0x19) {
          rj.infinity = t_1.infinity;
          rj.x.n[4] = t_1.x.n[4];
          rj.x.n[2] = t_1.x.n[2];
          rj.x.n[3] = t_1.x.n[3];
          rj.x.n[0] = t_1.x.n[0];
          rj.x.n[1] = t_1.x.n[1];
          rj.y.n[0] = t_1.y.n[0];
          rj.y.n[1] = t_1.y.n[1];
          rj.y.n[4] = t_1.y.n[4];
          rj.y.n[2] = t_1.y.n[2];
          rj.y.n[3] = t_1.y.n[3];
          rj.z.n[0] = 1;
          rj.z.n[3] = 0;
          rj.z.n[4] = 0;
          rj.z.n[1] = 0;
          rj.z.n[2] = 0;
        }
        else {
          iVar1 = 5;
          while (bVar13 = iVar1 != 0, iVar1 = iVar1 + -1, bVar13) {
            secp256k1_gej_double(&rj,&rj);
          }
          secp256k1_gej_add_ge(&rj,&rj,&t_1);
        }
        uVar4 = uVar3 >> 4 ^ 1;
        t_1.x.n[4] = px.n[4];
        t_1.x.n[2] = px.n[2];
        t_1.x.n[3] = px.n[3];
        t_1.x.n[0] = px.n[0];
        t_1.x.n[1] = px.n[1];
        t_1.y.n[0] = local_590;
        t_1.y.n[1] = uStack_588;
        t_1.y.n[4] = local_570;
        t_1.y.n[2] = local_580;
        t_1.y.n[3] = uStack_578;
        puVar7 = local_e48;
        for (uVar11 = 1; uVar11 != 0x10; uVar11 = uVar11 + 1) {
          uVar6 = (uint)(((-uVar4 ^ uVar3) & 0xf) == uVar11);
          secp256k1_fe_impl_cmov(&t_1.x,(secp256k1_fe *)(puVar7 + -5),uVar6);
          secp256k1_fe_impl_cmov(psVar9,(secp256k1_fe *)puVar7,uVar6);
          puVar7 = puVar7 + 0xb;
        }
        t_1.infinity = 0;
        local_db8.n[0] = 0x3ffffbfffff0bc - t_1.y.n[0];
        local_db8.n[1] = 0x3ffffffffffffc - t_1.y.n[1];
        local_db8.n[2] = 0x3ffffffffffffc - t_1.y.n[2];
        local_db8.n[3] = 0x3ffffffffffffc - t_1.y.n[3];
        local_db8.n[4] = 0x3fffffffffffc - t_1.y.n[4];
        secp256k1_fe_impl_cmov(psVar9,&local_db8,uVar4);
        secp256k1_gej_add_ge(&rj,&rj,&t_1);
        uVar11 = (ulong)((int)local_e38 - 1);
      }
      psVar9 = &rj.z;
      secp256k1_fe_impl_mul(psVar9,psVar9,&global_z);
      secp256k1_fe_impl_sqr(&i,psVar9);
      secp256k1_fe_impl_mul(&i,&i,&local_cc8);
      secp256k1_fe_impl_mul(&i,&i,&xd);
      secp256k1_fe_impl_inv(&i,&i);
      secp256k1_fe_impl_mul(&px,&rj.x,&i);
      secp256k1_fe_impl_normalize(&px);
      secp256k1_fe_impl_get_b32((uchar *)&i,&px);
      iVar1 = (*hashfp)(local_e30,(uchar *)&i,local_e28,local_e20,data);
      secp256k1_fe_impl_clear(&px);
      return (uint)(overflow == 0 && iVar1 != 0);
    }
    pvVar8 = (ctx->illegal_callback).data;
    pcVar10 = "hashfp != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar10,pvVar8);
  return 0;
}

Assistant:

int secp256k1_ellswift_xdh(const secp256k1_context *ctx, unsigned char *output, const unsigned char *ell_a64, const unsigned char *ell_b64, const unsigned char *seckey32, int party, secp256k1_ellswift_xdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow;
    secp256k1_scalar s;
    secp256k1_fe xn, xd, px, u, t;
    unsigned char sx[32];
    const unsigned char* theirs64;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(ell_a64 != NULL);
    ARG_CHECK(ell_b64 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(hashfp != NULL);

    /* Load remote public key (as fraction). */
    theirs64 = party ? ell_a64 : ell_b64;
    secp256k1_fe_set_b32_mod(&u, theirs64);
    secp256k1_fe_set_b32_mod(&t, theirs64 + 32);
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, &u, &t);

    /* Load private key (using one if invalid). */
    secp256k1_scalar_set_b32(&s, seckey32, &overflow);
    overflow = secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    /* Compute shared X coordinate. */
    secp256k1_ecmult_const_xonly(&px, &xn, &xd, &s, 1);
    secp256k1_fe_normalize(&px);
    secp256k1_fe_get_b32(sx, &px);

    /* Invoke hasher */
    ret = hashfp(output, sx, ell_a64, ell_b64, data);

    memset(sx, 0, 32);
    secp256k1_fe_clear(&px);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}